

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O1

void fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul
               (uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  
  uVar73 = arg1[4];
  uVar69 = arg2[4];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar73;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar69;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SUB168(auVar5 * auVar35,0);
  uVar70 = arg2[3];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar70;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar73;
  uVar71 = arg2[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar71;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar73;
  uVar72 = arg2[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar72;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar73;
  uVar1 = arg1[3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar69;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar70;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar71;
  uVar2 = arg1[2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar2;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar69;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar70;
  uVar3 = *arg2;
  uVar4 = arg1[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar4;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar69;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar3;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar73;
  uVar73 = uVar72 * 2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar73;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar3;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar1;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar71 * 2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar2;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar73;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar3;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar4;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar70 * 2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar4;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar71 * 2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar4;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar73;
  uVar73 = *arg1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar3;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar4;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar73;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar69;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar73;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar70;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar73;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar71;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar73;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar72;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar73;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar3;
  auVar62._8_8_ = SUB168(auVar5 * auVar35,8) * 0x269 + SUB168(auVar6 * ZEXT816(0x269),8);
  auVar62._0_8_ = SUB168(auVar6 * ZEXT816(0x269),0);
  auVar5 = auVar9 * auVar38 + auVar12 * auVar41 + auVar14 * auVar43 + auVar15 * auVar44;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar5._0_8_;
  auVar61._8_8_ = SUB168(auVar31 * ZEXT816(0x4d2),8) + auVar5._8_8_ * 0x4d2;
  auVar61._0_8_ = SUB168(auVar31 * ZEXT816(0x4d2),0);
  auVar61 = auVar30 * auVar59 + auVar61;
  uVar72 = auVar61._0_8_;
  uVar73 = auVar61._8_8_;
  auVar64._8_8_ = uVar73 >> 0x34;
  auVar64._0_8_ = uVar73 * 0x1000 | uVar72 >> 0x34;
  auVar5 = auVar10 * auVar39 + auVar7 * auVar36;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar5._0_8_;
  auVar65._8_8_ = auVar5._8_8_ * 0x269 + SUB168(auVar32 * ZEXT816(0x269),8);
  auVar65._0_8_ = SUB168(auVar32 * ZEXT816(0x269),0);
  auVar5 = auVar13 * auVar42 + auVar11 * auVar40 + auVar8 * auVar37;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar5._0_8_;
  auVar63._8_8_ = SUB168(auVar33 * ZEXT816(0x269),8) + auVar5._8_8_ * 0x269;
  auVar63._0_8_ = SUB168(auVar33 * ZEXT816(0x269),0);
  auVar64 = auVar29 * auVar58 + auVar25 * auVar54 + auVar63 + auVar64;
  uVar69 = auVar64._0_8_;
  uVar73 = auVar64._8_8_;
  auVar66._8_8_ = uVar73 >> 0x33;
  auVar66._0_8_ = uVar73 * 0x2000 | uVar69 >> 0x33;
  auVar66 = auVar21 * auVar50 + auVar24 * auVar53 + auVar65 + auVar28 * auVar57 + auVar66;
  uVar71 = auVar66._0_8_;
  uVar73 = auVar66._8_8_;
  auVar67._8_8_ = uVar73 >> 0x33;
  auVar67._0_8_ = uVar73 * 0x2000 | uVar71 >> 0x33;
  auVar67 = auVar20 * auVar49 + auVar62 + auVar23 * auVar52 + auVar18 * auVar47 + auVar27 * auVar56
            + auVar67;
  uVar70 = auVar67._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = auVar67._8_8_ * 0x2000 | uVar70 >> 0x33;
  auVar68 = auVar19 * auVar48 + auVar17 * auVar46 + auVar22 * auVar51 + auVar16 * auVar45 +
            auVar26 * auVar55 + auVar68;
  uVar73 = auVar68._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar68._8_8_ * 0x2000 | uVar73 >> 0x33;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar72 & 0xfffffffffffff;
  auVar60 = auVar34 * ZEXT816(0x269) + auVar60;
  uVar72 = auVar60._0_8_;
  uVar69 = (auVar60._8_8_ << 0xc | uVar72 >> 0x34) + (uVar69 & 0x7ffffffffffff);
  *out1 = uVar72 & 0xfffffffffffff;
  out1[1] = uVar69 & 0x7ffffffffffff;
  out1[2] = (uVar69 >> 0x33) + (uVar71 & 0x7ffffffffffff);
  out1[3] = uVar70 & 0x7ffffffffffff;
  out1[4] = uVar73 & 0x7ffffffffffff;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(
    uint64_t out1[5], const uint64_t arg1[5], const uint64_t arg2[5]) {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x1;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x2;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x3;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x4;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x5;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x6;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x7;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x8;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x9;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x10;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x11;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x12;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x13;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x14;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x15;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x16;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x17;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x18;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x19;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x20;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x21;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x22;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x23;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x24;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x25;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x26;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x27;
    uint64_t x28;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x29;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x30;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x31;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x32;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x33;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x34;
    uint64_t x35;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x36;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x37;
    uint64_t x38;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x39;
    uint64_t x40;
    uint64_t x41;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x42;
    uint64_t x43;
    uint64_t x44;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x45;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x50;
    uint64_t x51;
    uint64_t x52;
    x1 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
           (arg2[4])));
    x2 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
           (arg2[3])));
    x3 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
           (arg2[2])));
    x4 = (UINT16_C(0x269) *
          (((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
            (arg2[1])) *
           0x2));
    x5 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
           (arg2[4])));
    x6 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
           (arg2[3])));
    x7 = (UINT16_C(0x269) *
          (((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
            (arg2[2])) *
           0x2));
    x8 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
           (arg2[4])));
    x9 = (UINT16_C(0x269) *
          (((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
            (arg2[3])) *
           0x2));
    x10 = (UINT16_C(0x269) *
           (((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
             (arg2[4])) *
            0x2));
    x11 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
           (arg2[0]));
    x12 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
           ((arg2[1]) * 0x2));
    x13 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
           (arg2[0]));
    x14 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
           ((arg2[2]) * 0x2));
    x15 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
           ((arg2[1]) * 0x2));
    x16 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
           (arg2[0]));
    x17 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
           ((arg2[3]) * 0x2));
    x18 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
           ((arg2[2]) * 0x2));
    x19 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
           ((arg2[1]) * 0x2));
    x20 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
           (arg2[0]));
    x21 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[4]));
    x22 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[3]));
    x23 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[2]));
    x24 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[1]));
    x25 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[0]));
    x26 = (x25 + (x10 + (x9 + (x7 + x4))));
    x27 = (x26 >> 52);
    x28 = (uint64_t)(x26 & UINT64_C(0xfffffffffffff));
    x29 = (x21 + (x17 + (x14 + (x12 + x11))));
    x30 = (x22 + (x18 + (x15 + (x13 + x1))));
    x31 = (x23 + (x19 + (x16 + (x5 + x2))));
    x32 = (x24 + (x20 + (x8 + (x6 + x3))));
    x33 = (x27 + x32);
    x34 = (x33 >> 51);
    x35 = (uint64_t)(x33 & UINT64_C(0x7ffffffffffff));
    x36 = (x34 + x31);
    x37 = (x36 >> 51);
    x38 = (uint64_t)(x36 & UINT64_C(0x7ffffffffffff));
    x39 = (x37 + x30);
    x40 = (uint64_t)(x39 >> 51);
    x41 = (uint64_t)(x39 & UINT64_C(0x7ffffffffffff));
    x42 = (x40 + x29);
    x43 = (uint64_t)(x42 >> 51);
    x44 = (uint64_t)(x42 & UINT64_C(0x7ffffffffffff));
    x45 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)UINT16_C(0x269) *
           x43);
    x46 = (x28 + x45);
    x47 = (uint64_t)(x46 >> 52);
    x48 = (uint64_t)(x46 & UINT64_C(0xfffffffffffff));
    x49 = (x47 + x35);
    x50 = (fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1)(x49 >> 51);
    x51 = (x49 & UINT64_C(0x7ffffffffffff));
    x52 = (x50 + x38);
    out1[0] = x48;
    out1[1] = x51;
    out1[2] = x52;
    out1[3] = x41;
    out1[4] = x44;
}